

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableView::setSelection(QTableView *this,QRect *rect,SelectionFlags command)

{
  QSpanCollection *pQVar1;
  QPersistentModelIndex *pQVar2;
  QTableViewPrivate *this_00;
  QAbstractItemModel *pQVar3;
  int *piVar4;
  QObject *pQVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined8 *puVar14;
  undefined1 **ppuVar15;
  ulong uVar16;
  int iVar17;
  bool bVar18;
  int vertical;
  bool bVar19;
  _List_node_base *p_Var20;
  long in_FS_OFFSET;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  QModelIndex local_f0;
  QModelIndex local_d8;
  QModelIndex local_b8;
  QArrayDataPointer<QItemSelectionRange> local_98;
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  bVar7 = QWidget::isRightToLeft((QWidget *)this);
  iVar10 = (rect->x1).m_i;
  if (bVar7) {
    local_98.d = (Data *)CONCAT44(local_98.d._4_4_,iVar10);
    local_b8.r = (rect->x2).m_i;
    puVar14 = &local_98.d;
    if (iVar10 < local_b8.r) {
      puVar14 = (undefined8 *)&local_b8;
    }
  }
  else {
    local_98.d = (Data *)CONCAT44(local_98.d._4_4_,iVar10);
    local_b8.r = (rect->x2).m_i;
    puVar14 = (undefined8 *)&local_b8;
    if (iVar10 < local_b8.r) {
      puVar14 = &local_98.d;
    }
  }
  local_98.d = (Data *)CONCAT44(local_98.d._4_4_,iVar10);
  iVar10 = (rect->y1).m_i;
  local_78.c = (rect->y2).m_i;
  if (iVar10 < local_78.c) {
    local_78.c = iVar10;
  }
  local_78.r = *(int *)puVar14;
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x1f0))(&local_58,this,&local_78);
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  bVar7 = QWidget::isRightToLeft((QWidget *)this);
  local_b8.r = (rect->x1).m_i;
  if (bVar7) {
    local_d8.r = (rect->x2).m_i;
    ppuVar15 = (undefined1 **)&local_d8;
    if (local_b8.r < local_d8.r) {
      ppuVar15 = (undefined1 **)&local_b8;
    }
  }
  else {
    local_d8.r = (rect->x2).m_i;
    ppuVar15 = (undefined1 **)&local_b8;
    if (local_b8.r < local_d8.r) {
      ppuVar15 = (undefined1 **)&local_d8;
    }
  }
  iVar10 = (rect->y1).m_i;
  iVar11 = (rect->y2).m_i;
  if (iVar11 < iVar10) {
    iVar11 = iVar10;
  }
  local_98.d = (Data *)CONCAT44(iVar11,*(undefined4 *)ppuVar15);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x1f0))(&local_78,this);
  bVar7 = QPointer::operator_cast_to_bool
                    ((QPointer *)&(this_00->super_QAbstractItemViewPrivate).selectionModel);
  if (((((!bVar7) || (local_58.r < 0)) || ((long)local_58._0_8_ < 0)) ||
      (((local_58.m.ptr == (QAbstractItemModel *)0x0 || (local_78.r < 0)) ||
       (((long)local_78._0_8_ < 0 ||
        ((local_78.m.ptr == (QAbstractItemModel *)0x0 ||
         (pQVar3 = (this_00->super_QAbstractItemViewPrivate).model,
         uVar16 = (**(code **)(*(long *)pQVar3 + 0x138))(pQVar3,&local_58), (uVar16 & 0x20) == 0))))
       )))) || (pQVar3 = (this_00->super_QAbstractItemViewPrivate).model,
               uVar16 = (**(code **)(*(long *)pQVar3 + 0x138))(pQVar3,&local_78),
               (uVar16 & 0x20) == 0)) goto LAB_0052ca21;
  bVar7 = QHeaderView::sectionsMoved
                    (*(QHeaderView **)
                      (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget.field_0x8 + 0x588));
  bVar8 = QHeaderView::sectionsMoved
                    (*(QHeaderView **)
                      (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget.field_0x8 + 0x580));
  local_98.d = (Data *)0x0;
  local_98.ptr = (QItemSelectionRange *)0x0;
  local_98.size = 0;
  pQVar1 = &this_00->spans;
  if ((QSpanCollection *)
      (this_00->spans).spans.
      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
      _M_node.super__List_node_base._M_next == pQVar1) {
    local_124 = local_58.r;
    if (bVar7 && bVar8) {
      local_124 = QTableViewPrivate::visualRow(this_00,local_58.r);
      local_118 = QTableViewPrivate::visualRow(this_00,local_78.r);
      local_120 = QTableViewPrivate::visualColumn(this_00,local_58.c);
      local_11c = QTableViewPrivate::visualColumn(this_00,local_78.c);
      goto LAB_0052c50e;
    }
    if (bVar8) {
      local_118 = local_78.r;
      local_120 = QTableViewPrivate::visualColumn(this_00,local_58.c);
      local_11c = QTableViewPrivate::visualColumn(this_00,local_78.c);
      if (!bVar7) goto LAB_0052c63f;
      goto LAB_0052c51f;
    }
    if (!bVar7) goto LAB_0052c9a4;
    local_124 = QTableViewPrivate::visualRow(this_00,local_58.r);
    local_118 = QTableViewPrivate::visualRow(this_00,local_78.r);
    local_120 = local_58.c;
    local_11c = local_78.c;
LAB_0052c887:
    QList<QItemSelectionRange>::reserve
              ((QList<QItemSelectionRange> *)&local_98,(long)((local_118 - local_124) + 1));
    pQVar2 = &(this_00->super_QAbstractItemViewPrivate).root;
    for (; local_124 <= local_118; local_124 = local_124 + 1) {
      iVar10 = QTableViewPrivate::logicalRow(this_00,local_124);
      local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = (this_00->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_d8,pQVar2);
      (**(code **)(*(long *)pQVar3 + 0x60))(&local_b8,pQVar3,iVar10,local_120,&local_d8);
      local_d8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = (this_00->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_f0,pQVar2);
      (**(code **)(*(long *)pQVar3 + 0x60))(&local_d8,pQVar3,iVar10,local_11c,&local_f0);
      QItemSelectionRange::QItemSelectionRange((QItemSelectionRange *)&local_f0,&local_b8,&local_d8)
      ;
      QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                ((QList<QItemSelectionRange> *)&local_98,(QItemSelectionRange *)&local_f0);
      QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)&local_f0);
    }
  }
  else {
    iVar10 = QTableViewPrivate::visualRow(this_00,local_58.r);
    local_124 = QTableViewPrivate::visualRow(this_00,local_78.r);
    if (iVar10 < local_124) {
      local_124 = iVar10;
    }
    iVar10 = QTableViewPrivate::visualColumn(this_00,local_58.c);
    local_120 = QTableViewPrivate::visualColumn(this_00,local_78.c);
    if (iVar10 < local_120) {
      local_120 = iVar10;
    }
    iVar10 = QTableViewPrivate::visualRow(this_00,local_58.r);
    local_118 = QTableViewPrivate::visualRow(this_00,local_78.r);
    if (local_118 < iVar10) {
      local_118 = iVar10;
    }
    iVar10 = QTableViewPrivate::visualColumn(this_00,local_58.c);
    local_11c = QTableViewPrivate::visualColumn(this_00,local_78.c);
    if (local_11c < iVar10) {
      local_11c = iVar10;
    }
    bVar18 = false;
    p_Var20 = (_List_node_base *)pQVar1;
    bVar19 = false;
    do {
      do {
        while (p_Var20 = (((SpanList *)&p_Var20->_M_next)->
                         super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                         )._M_impl._M_node.super__List_node_base._M_next,
              (QSpanCollection *)p_Var20 == pQVar1) {
          bVar6 = !bVar19;
          p_Var20 = (_List_node_base *)pQVar1;
          bVar19 = false;
          if (bVar6) {
            if (!bVar18) {
              local_120 = local_58.c;
              local_118 = local_78.r;
              local_11c = local_78.c;
              local_124 = local_58.r;
              goto LAB_0052c50e;
            }
            goto LAB_0052c45b;
          }
        }
        piVar4 = *(int **)(p_Var20 + 1);
        iVar10 = QTableViewPrivate::visualRow(this_00,*piVar4);
        iVar11 = QTableViewPrivate::visualColumn(this_00,piVar4[1]);
        iVar12 = QTableViewPrivate::rowSpanEndLogical(this_00,*piVar4,(piVar4[2] - *piVar4) + 1);
        iVar12 = QTableViewPrivate::visualRow(this_00,iVar12);
        iVar13 = QTableViewPrivate::columnSpanEndLogical
                           (this_00,piVar4[1],(piVar4[3] - piVar4[1]) + 1);
        iVar13 = QTableViewPrivate::visualColumn(this_00,iVar13);
      } while ((((local_118 < iVar10) || (local_11c < iVar11)) || (iVar12 < local_124)) ||
              (iVar13 < local_120));
      iVar17 = local_124;
      if (iVar10 < local_124) {
        iVar17 = iVar10;
      }
      bVar18 = true;
      if (iVar10 < local_124) {
        bVar19 = bVar18;
      }
      if (iVar11 < local_120) {
        local_120 = iVar11;
        bVar19 = bVar18;
      }
      if (local_118 < iVar12) {
        local_118 = iVar12;
        bVar19 = bVar18;
      }
      bVar6 = bVar19;
      if (local_11c < iVar13) {
        local_11c = iVar13;
        bVar6 = bVar18;
      }
      bVar18 = true;
      local_124 = iVar17;
      bVar19 = bVar6;
    } while ((!bVar6) || (bVar19 = false, p_Var20 = (_List_node_base *)pQVar1, bVar6));
LAB_0052c45b:
    if (bVar7) {
LAB_0052c50e:
      if (!bVar7 || !bVar8) {
        if (bVar8) goto LAB_0052c63f;
        if (bVar7) goto LAB_0052c887;
        goto LAB_0052c9a4;
      }
LAB_0052c51f:
      QList<QItemSelectionRange>::reserve
                ((QList<QItemSelectionRange> *)&local_98,
                 (long)(((local_118 - local_124) + 1) * ((local_11c - local_120) + 1)));
      for (; local_120 <= local_11c; local_120 = local_120 + 1) {
        iVar11 = QTableViewPrivate::logicalColumn(this_00,local_120);
        for (iVar10 = local_124; iVar10 <= local_118; iVar10 = iVar10 + 1) {
          iVar12 = QTableViewPrivate::logicalRow(this_00,iVar10);
          local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          pQVar3 = (this_00->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    (&local_d8,&(this_00->super_QAbstractItemViewPrivate).root);
          (**(code **)(*(long *)pQVar3 + 0x60))(&local_b8,pQVar3,iVar12,iVar11,&local_d8);
          QItemSelectionRange::QItemSelectionRange((QItemSelectionRange *)&local_d8,&local_b8);
          QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                    ((QList<QItemSelectionRange> *)&local_98,(QItemSelectionRange *)&local_d8);
          QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)&local_d8);
        }
      }
    }
    else if (bVar8) {
LAB_0052c63f:
      QList<QItemSelectionRange>::reserve
                ((QList<QItemSelectionRange> *)&local_98,(long)((local_11c - local_120) + 1));
      pQVar2 = &(this_00->super_QAbstractItemViewPrivate).root;
      for (; local_120 <= local_11c; local_120 = local_120 + 1) {
        iVar10 = QTableViewPrivate::logicalColumn(this_00,local_120);
        local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        pQVar3 = (this_00->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_d8,pQVar2);
        (**(code **)(*(long *)pQVar3 + 0x60))(&local_b8,pQVar3,local_124,iVar10,&local_d8);
        local_d8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        pQVar3 = (this_00->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_f0,pQVar2);
        (**(code **)(*(long *)pQVar3 + 0x60))(&local_d8,pQVar3,local_118,iVar10,&local_f0);
        QItemSelectionRange::QItemSelectionRange
                  ((QItemSelectionRange *)&local_f0,&local_b8,&local_d8);
        QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                  ((QList<QItemSelectionRange> *)&local_98,(QItemSelectionRange *)&local_f0);
        QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)&local_f0);
      }
    }
    else {
      pQVar3 = (this_00->super_QAbstractItemViewPrivate).model;
      pQVar2 = &(this_00->super_QAbstractItemViewPrivate).root;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_d8,pQVar2);
      (**(code **)(*(long *)pQVar3 + 0x60))(&local_b8,pQVar3,local_124,local_120,&local_d8);
      local_58.m.ptr = local_b8.m.ptr;
      local_58.r = local_b8.r;
      local_58.c = local_b8.c;
      local_58.i = local_b8.i;
      pQVar3 = (this_00->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_d8,pQVar2);
      (**(code **)(*(long *)pQVar3 + 0x60))(&local_b8,pQVar3,local_118,local_11c,&local_d8);
      local_78.m.ptr = local_b8.m.ptr;
      local_78.r = local_b8.r;
      local_78.c = local_b8.c;
      local_78.i = local_b8.i;
LAB_0052c9a4:
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      QItemSelectionRange::QItemSelectionRange((QItemSelectionRange *)&local_b8,&local_58,&local_78)
      ;
      cVar9 = QItemSelectionRange::isEmpty();
      if (cVar9 == '\0') {
        QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange_const&>
                  ((QList<QItemSelectionRange> *)&local_98,(QItemSelectionRange *)&local_b8);
      }
      QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)&local_b8);
    }
  }
  pQVar5 = (this_00->super_QAbstractItemViewPrivate).selectionModel.wp.value;
  (**(code **)(*(long *)pQVar5 + 0x70))
            (pQVar5,&local_98,
             command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_98);
LAB_0052ca21:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::setSelection(const QRect &rect, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QTableView);
    QModelIndex tl = indexAt(QPoint(isRightToLeft() ? qMax(rect.left(), rect.right())
                                    : qMin(rect.left(), rect.right()), qMin(rect.top(), rect.bottom())));
    QModelIndex br = indexAt(QPoint(isRightToLeft() ? qMin(rect.left(), rect.right()) :
                                    qMax(rect.left(), rect.right()), qMax(rect.top(), rect.bottom())));
    if (!d->selectionModel || !tl.isValid() || !br.isValid() || !d->isIndexEnabled(tl) || !d->isIndexEnabled(br))
        return;

    const bool verticalMoved = verticalHeader()->sectionsMoved();
    const bool horizontalMoved = horizontalHeader()->sectionsMoved();

    QItemSelection selection;
    int top = tl.row();
    int bottom = br.row();
    int left = tl.column();
    int right = br.column();

    if (d->hasSpans()) {
        bool expanded;
        // when the current selection does not intersect with any spans of merged cells,
        // the range of selected cells must be the same as if there were no merged cells
        bool intersectsSpan = false;
        top = qMin(d->visualRow(tl.row()), d->visualRow(br.row()));
        left = qMin(d->visualColumn(tl.column()), d->visualColumn(br.column()));
        bottom = qMax(d->visualRow(tl.row()), d->visualRow(br.row()));
        right = qMax(d->visualColumn(tl.column()), d->visualColumn(br.column()));
        do {
            expanded = false;
            for (QSpanCollection::Span *it : d->spans.spans) {
                const QSpanCollection::Span &span = *it;
                const int t = d->visualRow(span.top());
                const int l = d->visualColumn(span.left());
                const int b = d->visualRow(d->rowSpanEndLogical(span.top(), span.height()));
                const int r = d->visualColumn(d->columnSpanEndLogical(span.left(), span.width()));
                if ((t > bottom) || (l > right) || (top > b) || (left > r))
                    continue; // no intersect
                intersectsSpan = true;
                if (t < top) {
                    top = t;
                    expanded = true;
                }
                if (l < left) {
                    left = l;
                    expanded = true;
                }
                if (b > bottom) {
                    bottom = b;
                    expanded = true;
                }
                if (r > right) {
                    right = r;
                    expanded = true;
                }
                if (expanded)
                    break;
            }
        } while (expanded);
        if (!intersectsSpan) {
            top = tl.row();
            bottom = br.row();
            left = tl.column();
            right = br.column();
        } else if (!verticalMoved && !horizontalMoved) {
            // top/left/bottom/right are visual, update indexes
            tl = d->model->index(top, left, d->root);
            br = d->model->index(bottom, right, d->root);
        }
    } else if (verticalMoved && horizontalMoved) {
         top = d->visualRow(tl.row());
         bottom = d->visualRow(br.row());
         left = d->visualColumn(tl.column());
         right = d->visualColumn(br.column());
    } else if (horizontalMoved) {
        top = tl.row();
        bottom = br.row();
        left = d->visualColumn(tl.column());
        right = d->visualColumn(br.column());
    } else if (verticalMoved) {
        top = d->visualRow(tl.row());
        bottom = d->visualRow(br.row());
        left = tl.column();
        right = br.column();
    }

    if (horizontalMoved && verticalMoved) {
         selection.reserve((right - left + 1) * (bottom - top + 1));
         for (int horizontal = left; horizontal <= right; ++horizontal) {
             int column = d->logicalColumn(horizontal);
             for (int vertical = top; vertical <= bottom; ++vertical) {
                 int row = d->logicalRow(vertical);
                 QModelIndex index = d->model->index(row, column, d->root);
                 selection.append(QItemSelectionRange(index));
             }
         }
    } else if (horizontalMoved) {
        selection.reserve(right - left + 1);
        for (int visual = left; visual <= right; ++visual) {
            int column = d->logicalColumn(visual);
            QModelIndex topLeft = d->model->index(top, column, d->root);
            QModelIndex bottomRight = d->model->index(bottom, column, d->root);
            selection.append(QItemSelectionRange(topLeft, bottomRight));
        }
    } else if (verticalMoved) {
        selection.reserve(bottom - top + 1);
        for (int visual = top; visual <= bottom; ++visual) {
            int row = d->logicalRow(visual);
            QModelIndex topLeft = d->model->index(row, left, d->root);
            QModelIndex bottomRight = d->model->index(row, right, d->root);
            selection.append(QItemSelectionRange(topLeft, bottomRight));
        }
    } else { // nothing moved
        QItemSelectionRange range(tl, br);
        if (!range.isEmpty())
            selection.append(range);
    }

    d->selectionModel->select(selection, command);
}